

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O0

void initBiomeNoise(BiomeNoise *bn,int mc)

{
  int iVar1;
  SplineStack *ss_00;
  Spline *rsp;
  Spline *val;
  Spline *val_00;
  Spline *val_01;
  Spline *val_02;
  Spline *pSVar2;
  undefined4 in_ESI;
  long in_RDI;
  int in_stack_00000014;
  float in_stack_00000018;
  float in_stack_0000001c;
  float in_stack_00000020;
  float in_stack_00000024;
  Spline *sp4;
  Spline *sp3;
  Spline *sp2;
  Spline *sp1;
  Spline *sp;
  SplineStack *ss;
  
  ss_00 = (SplineStack *)(in_RDI + 0x3a78);
  memset(ss_00,0,0x2590);
  iVar1 = *(int *)(in_RDI + 0x6000);
  *(int *)(in_RDI + 0x6000) = iVar1 + 1;
  rsp = ss_00->stack + iVar1;
  rsp->typ = 0;
  val = createLandSpline((SplineStack *)sp3,sp4._4_4_,sp4._0_4_,in_stack_00000024,in_stack_00000020,
                         in_stack_0000001c,in_stack_00000018,in_stack_00000014);
  val_00 = createLandSpline((SplineStack *)sp3,sp4._4_4_,sp4._0_4_,in_stack_00000024,
                            in_stack_00000020,in_stack_0000001c,in_stack_00000018,in_stack_00000014)
  ;
  val_01 = createLandSpline((SplineStack *)sp3,sp4._4_4_,sp4._0_4_,in_stack_00000024,
                            in_stack_00000020,in_stack_0000001c,in_stack_00000018,in_stack_00000014)
  ;
  val_02 = createLandSpline((SplineStack *)sp3,sp4._4_4_,sp4._0_4_,in_stack_00000024,
                            in_stack_00000020,in_stack_0000001c,in_stack_00000018,in_stack_00000014)
  ;
  pSVar2 = createFixSpline(ss_00,0.044);
  addSplineVal(rsp,-1.1,pSVar2,0.0);
  pSVar2 = createFixSpline(ss_00,-0.2222);
  addSplineVal(rsp,-1.02,pSVar2,0.0);
  pSVar2 = createFixSpline(ss_00,-0.2222);
  addSplineVal(rsp,-0.51,pSVar2,0.0);
  pSVar2 = createFixSpline(ss_00,-0.12);
  addSplineVal(rsp,-0.44,pSVar2,0.0);
  pSVar2 = createFixSpline(ss_00,-0.12);
  addSplineVal(rsp,-0.18,pSVar2,0.0);
  addSplineVal(rsp,-0.16,val,0.0);
  addSplineVal(rsp,-0.15,val,0.0);
  addSplineVal(rsp,-0.1,val_00,0.0);
  addSplineVal(rsp,0.25,val_01,0.0);
  addSplineVal(rsp,1.0,val_02,0.0);
  *(Spline **)(in_RDI + 0x3a70) = rsp;
  *(undefined4 *)(in_RDI + 0x600c) = in_ESI;
  return;
}

Assistant:

void initBiomeNoise(BiomeNoise *bn, int mc)
{
    SplineStack *ss = &bn->ss;
    memset(ss, 0, sizeof(*ss));
    Spline *sp = &ss->stack[ss->len++];
    sp->typ = SP_CONTINENTALNESS;

    Spline *sp1 = createLandSpline(ss, -0.15F, 0.00F, 0.0F, 0.1F, 0.00F, -0.03F, 0);
    Spline *sp2 = createLandSpline(ss, -0.10F, 0.03F, 0.1F, 0.1F, 0.01F, -0.03F, 0);
    Spline *sp3 = createLandSpline(ss, -0.10F, 0.03F, 0.1F, 0.7F, 0.01F, -0.03F, 1);
    Spline *sp4 = createLandSpline(ss, -0.05F, 0.03F, 0.1F, 1.0F, 0.01F,  0.01F, 1);

    addSplineVal(sp, -1.10F, createFixSpline(ss,  0.044F), 0.0F);
    addSplineVal(sp, -1.02F, createFixSpline(ss, -0.2222F), 0.0F);
    addSplineVal(sp, -0.51F, createFixSpline(ss, -0.2222F), 0.0F);
    addSplineVal(sp, -0.44F, createFixSpline(ss, -0.12F), 0.0F);
    addSplineVal(sp, -0.18F, createFixSpline(ss, -0.12F), 0.0F);
    addSplineVal(sp, -0.16F, sp1, 0.0F);
    addSplineVal(sp, -0.15F, sp1, 0.0F);
    addSplineVal(sp, -0.10F, sp2, 0.0F);
    addSplineVal(sp,  0.25F, sp3, 0.0F);
    addSplineVal(sp,  1.00F, sp4, 0.0F);

    bn->sp = sp;
    bn->mc = mc;
}